

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O0

char * lua_setlocal(lua_State *L,lua_Debug *ar,int n)

{
  char *pcVar1;
  char *pcVar2;
  TValue *io1;
  char *name;
  StkId pos;
  lua_Debug *plStack_18;
  int n_local;
  lua_Debug *ar_local;
  lua_State *L_local;
  
  name = (char *)0x0;
  pos._4_4_ = n;
  plStack_18 = ar;
  ar_local = (lua_Debug *)L;
  swapextra(L);
  pcVar2 = findlocal((lua_State *)ar_local,plStack_18->i_ci,pos._4_4_,(StkId *)&name);
  if (pcVar2 != (char *)0x0) {
    pcVar1 = ar_local->namewhat;
    *(undefined8 *)name = *(undefined8 *)(pcVar1 + -0x10);
    *(undefined8 *)(name + 8) = *(undefined8 *)(pcVar1 + -8);
    ar_local->namewhat = ar_local->namewhat + -0x10;
  }
  swapextra((lua_State *)ar_local);
  return pcVar2;
}

Assistant:

LUA_API const char *lua_setlocal(lua_State *L, const lua_Debug *ar, int n) {
    StkId pos = NULL;  /* to avoid warnings */
    const char *name;
    lua_lock(L);
    swapextra(L);
    name = findlocal(L, ar->i_ci, n, &pos);
    if (name) {
        setobjs2s(L, pos, L->top - 1);
        L->top--;  /* pop value */
    }
    swapextra(L);
    lua_unlock(L);
    return name;
}